

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

int __thiscall QAbstractSpinBoxPrivate::init(QAbstractSpinBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QWidget *parent;
  int iVar2;
  QLineEdit *this_00;
  QSpinBoxValidator *this_01;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QStyleOptionSpinBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(this_00,parent);
  QAbstractSpinBox::setLineEdit((QAbstractSpinBox *)parent,this_00);
  QVar4.m_size = (size_t)"qt_spinbox_lineedit";
  QVar4.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->edit;
  QObject::setObjectName(QVar4);
  this_01 = (QSpinBoxValidator *)operator_new(0x20);
  QSpinBoxValidator::QSpinBoxValidator(this_01,(QAbstractSpinBox *)parent,this);
  this->validator = this_01;
  QLineEdit::setValidator(this->edit,(QValidator *)this_01);
  opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.palette.d =
       (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionSpinBox::QStyleOptionSpinBox(&opt);
  (**(code **)(*(long *)parent + 0x1c0))(parent,&opt);
  pQVar3 = QWidget::style(parent);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x2c,&opt,parent,0);
  this->spinClickTimerInterval = iVar2;
  pQVar3 = QWidget::style(parent);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x53,&opt,parent,0);
  this->spinClickThresholdTimerInterval = iVar2;
  QWidget::setFocusPolicy(parent,WheelFocus);
  QWidget::setSizePolicy(parent,(QSizePolicy)0xc010000);
  QWidget::setAttribute(parent,WA_InputMethodEnabled,true);
  QWidget::setAttribute(parent,WA_MacShowFocusRect,true);
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::init()
{
    Q_Q(QAbstractSpinBox);

    q->setLineEdit(new QLineEdit(q));
    edit->setObjectName("qt_spinbox_lineedit"_L1);
    validator = new QSpinBoxValidator(q, this);
    edit->setValidator(validator);

    QStyleOptionSpinBox opt;
    // ### This is called from the ctor and thus we shouldn't call initStyleOption yet
    // ### as we only call the base class implementation of initStyleOption called.
    q->initStyleOption(&opt);
    spinClickTimerInterval = q->style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatRate, &opt, q);
    spinClickThresholdTimerInterval = q->style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatThreshold, &opt, q);
    q->setFocusPolicy(Qt::WheelFocus);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed, QSizePolicy::SpinBox));
    q->setAttribute(Qt::WA_InputMethodEnabled);

    q->setAttribute(Qt::WA_MacShowFocusRect);
}